

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.h
# Opt level: O0

void __thiscall
btDbvt::rayTestInternal
          (btDbvt *this,btDbvtNode *root,btVector3 *rayFrom,btVector3 *rayTo,
          btVector3 *rayDirectionInverse,uint *signs,btScalar lambda_max,btVector3 *aabbMin,
          btVector3 *aabbMax,ICollide *policy)

{
  btDbvtNode *pbVar1;
  btDbvtNode *pbVar2;
  bool bVar3;
  btDbvtNode **ppbVar4;
  btDbvtNode *in_RSI;
  long in_RDI;
  btVector3 *rayFrom_00;
  btVector3 bVar5;
  long *in_stack_00000018;
  uint result1;
  btScalar lambda_min;
  btScalar tmin;
  btDbvtNode *node;
  btVector3 bounds [2];
  btAlignedObjectArray<const_btDbvtNode_*> *stack;
  int treshold;
  int depth;
  btVector3 resultNormal;
  btAlignedObjectArray<const_btDbvtNode_*> *in_stack_ffffffffffffff08;
  btDbvtNode **in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  int iVar7;
  btDbvtNode *pbVar6;
  btAlignedObjectArray<const_btDbvtNode_*> *in_stack_ffffffffffffff20;
  btAlignedObjectArray<const_btDbvtNode_*> *this_00;
  btVector3 *local_d8;
  btScalar in_stack_ffffffffffffff40;
  btVector3 *pbVar8;
  btVector3 *local_88;
  btVector3 *pbStack_80;
  btVector3 *local_78;
  uint *local_70;
  btAlignedObjectArray<const_btDbvtNode_*> bStack_68;
  int local_48;
  btVector3 local_44 [3];
  btDbvtNode *local_10;
  
  iVar7 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  if (in_RSI != (btDbvtNode *)0x0) {
    local_10 = in_RSI;
    btVector3::btVector3(local_44);
    local_48 = 1;
    bStack_68._28_4_ = 0x7e;
    bStack_68.m_data = (btDbvtNode **)(in_RDI + 0x40);
    bStack_68.m_capacity = 0;
    bStack_68._12_4_ = 0;
    btAlignedObjectArray<const_btDbvtNode_*>::resize
              (in_stack_ffffffffffffff20,iVar7,in_stack_ffffffffffffff10);
    ppbVar4 = btAlignedObjectArray<const_btDbvtNode_*>::operator[]
                        ((btAlignedObjectArray<const_btDbvtNode_*> *)bStack_68.m_data,0);
    *ppbVar4 = local_10;
    this_00 = &bStack_68;
    pbVar6 = local_10;
    pbVar8 = (btVector3 *)&local_88;
    do {
      local_d8 = pbVar8;
      btVector3::btVector3(local_d8);
      pbVar8 = local_d8 + 1;
    } while ((btAlignedObjectArray<const_btDbvtNode_*> *)(local_d8 + 1) != this_00);
    do {
      local_48 = local_48 + -1;
      ppbVar4 = btAlignedObjectArray<const_btDbvtNode_*>::operator[]
                          ((btAlignedObjectArray<const_btDbvtNode_*> *)bStack_68.m_data,local_48);
      pbVar1 = *ppbVar4;
      btDbvtAabbMm::Mins(&pbVar1->volume);
      bVar5 = operator-(local_d8,(btVector3 *)in_stack_ffffffffffffff08);
      rayFrom_00 = bVar5.m_floats._8_8_;
      pbVar8 = bVar5.m_floats._0_8_;
      local_88 = pbVar8;
      pbStack_80 = rayFrom_00;
      btDbvtAabbMm::Maxs(&pbVar1->volume);
      bVar5 = operator-(local_d8,(btVector3 *)in_stack_ffffffffffffff08);
      local_70 = bVar5.m_floats._8_8_;
      local_78 = bVar5.m_floats._0_8_;
      bVar3 = btRayAabb2(rayFrom_00,pbVar8,local_70,local_78,(btScalar *)0x3f80000000000000,0.0,
                         in_stack_ffffffffffffff40);
      if (bVar3) {
        bVar3 = btDbvtNode::isinternal((btDbvtNode *)0x162ad2);
        if (bVar3) {
          if ((int)bStack_68._28_4_ < local_48) {
            in_stack_ffffffffffffff08 = (btAlignedObjectArray<const_btDbvtNode_*> *)bStack_68.m_data
            ;
            btAlignedObjectArray<const_btDbvtNode_*>::size
                      ((btAlignedObjectArray<const_btDbvtNode_*> *)bStack_68.m_data);
            btAlignedObjectArray<const_btDbvtNode_*>::resize
                      (this_00,(int)((ulong)pbVar6 >> 0x20),(btDbvtNode **)local_d8);
            bStack_68._28_4_ =
                 btAlignedObjectArray<const_btDbvtNode_*>::size
                           ((btAlignedObjectArray<const_btDbvtNode_*> *)bStack_68.m_data);
            bStack_68._28_4_ = bStack_68._28_4_ + -2;
          }
          iVar7 = local_48;
          pbVar2 = (pbVar1->field_2).childs[0];
          local_48 = local_48 + 1;
          ppbVar4 = btAlignedObjectArray<const_btDbvtNode_*>::operator[]
                              ((btAlignedObjectArray<const_btDbvtNode_*> *)bStack_68.m_data,iVar7);
          iVar7 = local_48;
          *ppbVar4 = pbVar2;
          pbVar1 = *(btDbvtNode **)((long)&pbVar1->field_2 + 8);
          local_48 = local_48 + 1;
          ppbVar4 = btAlignedObjectArray<const_btDbvtNode_*>::operator[]
                              ((btAlignedObjectArray<const_btDbvtNode_*> *)bStack_68.m_data,iVar7);
          *ppbVar4 = pbVar1;
        }
        else {
          (**(code **)(*in_stack_00000018 + 0x18))(in_stack_00000018,pbVar1);
        }
      }
    } while (local_48 != 0);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void		btDbvt::rayTestInternal(	const btDbvtNode* root,
								const btVector3& rayFrom,
								const btVector3& rayTo,
								const btVector3& rayDirectionInverse,
								unsigned int signs[3],
								btScalar lambda_max,
								const btVector3& aabbMin,
								const btVector3& aabbMax,
								DBVT_IPOLICY) const
{
        (void) rayTo;
	DBVT_CHECKTYPE
	if(root)
	{
		btVector3 resultNormal;

		int								depth=1;
		int								treshold=DOUBLE_STACKSIZE-2;
		btAlignedObjectArray<const btDbvtNode*>&	stack = m_rayTestStack;
		stack.resize(DOUBLE_STACKSIZE);
		stack[0]=root;
		btVector3 bounds[2];
		do	
		{
			const btDbvtNode*	node=stack[--depth];
			bounds[0] = node->volume.Mins()-aabbMax;
			bounds[1] = node->volume.Maxs()-aabbMin;
			btScalar tmin=1.f,lambda_min=0.f;
			unsigned int result1=false;
			result1 = btRayAabb2(rayFrom,rayDirectionInverse,signs,bounds,tmin,lambda_min,lambda_max);
			if(result1)
			{
				if(node->isinternal())
				{
					if(depth>treshold)
					{
						stack.resize(stack.size()*2);
						treshold=stack.size()-2;
					}
					stack[depth++]=node->childs[0];
					stack[depth++]=node->childs[1];
				}
				else
				{
					policy.Process(node);
				}
			}
		} while(depth);
	}
}